

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O1

void * __thiscall
axl::io::MappedFile::view
          (MappedFile *this,uint64_t offset,size_t size,size_t *actualSize,bool isPermanent)

{
  uint64_t in_RAX;
  void *pvVar1;
  uint64_t end;
  uint64_t actualEnd;
  uint64_t local_28;
  
  local_28 = in_RAX;
  if (size == 0) {
    end = psx::File::getSize((File *)this);
  }
  else {
    end = size + offset;
  }
  pvVar1 = viewImpl(this,offset,end,&local_28,isPermanent);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else if (actualSize != (size_t *)0x0) {
    *actualSize = local_28 - offset;
  }
  return pvVar1;
}

Assistant:

void*
MappedFile::view(
	uint64_t offset,
	size_t size,
	size_t* actualSize,
	bool isPermanent
) {
	uint64_t end = size ? offset + size : m_file.getSize();

	uint64_t actualEnd;
	void* p = viewImpl(offset, end, &actualEnd, isPermanent);
	if (!p)
		return NULL;

	if (actualSize)
		*actualSize = (size_t)(actualEnd - offset);

	return p;
}